

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)2002>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  bool bVar1;
  VisionFeaturePrintTypeCase VVar2;
  VisionFeaturePrint_Scene_SceneVersion VVar3;
  VisionFeaturePrint_Objects_ObjectsVersion VVar4;
  int iVar5;
  CoreML *pCVar6;
  VisionFeaturePrint_Scene *pVVar7;
  VisionFeaturePrint_Objects *pVVar8;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  reference from;
  ostream *poVar9;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  stringstream local_4d0 [8];
  stringstream ss;
  ostream local_4c0 [376];
  iterator local_348;
  void **local_340;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_328;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *visionFeaturePrintOutputNames;
  string *modelOutputFeatureName;
  FeatureDescription modelOutputFeature;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_26d;
  TypeCase local_26c;
  iterator local_268;
  size_type local_260;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_258;
  Result local_240;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_165;
  TypeCase local_164;
  iterator local_160;
  size_type local_158;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_150;
  Result local_138;
  allocator<char> local_109;
  string local_108;
  VisionFeaturePrint *local_e8;
  VisionFeaturePrint *visionFeaturePrint;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d5;
  TypeCase local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined1 local_80 [8];
  Result result;
  allocator<char> local_41;
  string local_40;
  ModelDescription *local_20;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_20 = Specification::Model::description(format);
  bVar1 = Specification::Model::has_visionfeatureprint((Model *)interface);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Model not a vision feature print.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    return __return_storage_ptr__;
  }
  Result::Result((Result *)local_80);
  pCVar6 = (CoreML *)Specification::ModelDescription::input(local_20);
  local_d4 = kImageType;
  local_d0 = &local_d4;
  local_c8 = 1;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d5);
  __l_01._M_len = local_c8;
  __l_01._M_array = local_d0;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_c0,__l_01,&local_d5);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_a8,pCVar6,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
             (int)&local_c0,in_R8);
  Result::operator=((Result *)local_80,&local_a8);
  Result::~Result(&local_a8);
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector(&local_c0);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d5);
  bVar1 = Result::good((Result *)local_80);
  if (bVar1) {
    local_e8 = Specification::Model::visionfeatureprint((Model *)interface);
    VVar2 = Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrintType_case(local_e8);
    if (VVar2 == VISIONFEATUREPRINTTYPE_NOT_SET) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"Type for vision feature print not set",&local_511);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      visionFeaturePrint._4_4_ = 1;
    }
    else {
      if (VVar2 == kScene) {
        pVVar7 = Specification::CoreMLModels::VisionFeaturePrint::scene(local_e8);
        VVar3 = Specification::CoreMLModels::VisionFeaturePrint_Scene::version(pVVar7);
        if (VVar3 == VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_INVALID) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"Version for scene is invalid",&local_109);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::allocator<char>::~allocator(&local_109);
          visionFeaturePrint._4_4_ = 1;
          goto LAB_00477184;
        }
        pVVar7 = Specification::CoreMLModels::VisionFeaturePrint::scene(local_e8);
        VVar3 = Specification::CoreMLModels::VisionFeaturePrint_Scene::version(pVVar7);
        if (VVar3 != VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1) {
          pVVar7 = Specification::CoreMLModels::VisionFeaturePrint::scene(local_e8);
          VVar3 = Specification::CoreMLModels::VisionFeaturePrint_Scene::version(pVVar7);
          if (VVar3 != VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_2) {
            pVVar7 = Specification::CoreMLModels::VisionFeaturePrint::scene(local_e8);
            VVar3 = Specification::CoreMLModels::VisionFeaturePrint_Scene::version(pVVar7);
            std::__cxx11::to_string(&local_1c8,VVar3);
            std::operator+(&local_1a8,"Version: \'",&local_1c8);
            std::operator+(&local_188,&local_1a8,"\' for scene print is invalid");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1c8);
            visionFeaturePrint._4_4_ = 1;
            goto LAB_00477184;
          }
        }
        pCVar6 = (CoreML *)Specification::ModelDescription::output(local_20);
        local_164 = kMultiArrayType;
        local_160 = &local_164;
        local_158 = 1;
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_165);
        __l_00._M_len = local_158;
        __l_00._M_array = local_160;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector(&local_150,__l_00,&local_165);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  (&local_138,pCVar6,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
                   (int)&local_150,in_R8);
        Result::operator=((Result *)local_80,&local_138);
        Result::~Result(&local_138);
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~vector(&local_150);
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_165);
        bVar1 = Result::good((Result *)local_80);
        if (!bVar1) {
          Result::Result(__return_storage_ptr__,(Result *)local_80);
          visionFeaturePrint._4_4_ = 1;
          goto LAB_00477184;
        }
      }
      else if (VVar2 == kObjects) {
        pVVar8 = Specification::CoreMLModels::VisionFeaturePrint::objects(local_e8);
        VVar4 = Specification::CoreMLModels::VisionFeaturePrint_Objects::version(pVVar8);
        if (VVar4 == VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e8,"Version for objects is invalid",&local_1e9);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator(&local_1e9);
          visionFeaturePrint._4_4_ = 1;
          goto LAB_00477184;
        }
        pVVar8 = Specification::CoreMLModels::VisionFeaturePrint::objects(local_e8);
        VVar4 = Specification::CoreMLModels::VisionFeaturePrint_Objects::version(pVVar8);
        if (VVar4 != VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1) {
          pVVar8 = Specification::CoreMLModels::VisionFeaturePrint::objects(local_e8);
          VVar4 = Specification::CoreMLModels::VisionFeaturePrint_Objects::version(pVVar8);
          std::__cxx11::to_string((string *)&__range2,VVar4);
          std::operator+(&local_2b0,"Version: \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2);
          std::operator+(&local_290,&local_2b0,"\' for object print is invalid");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&__range2);
          visionFeaturePrint._4_4_ = 1;
          goto LAB_00477184;
        }
        pVVar8 = Specification::CoreMLModels::VisionFeaturePrint::objects(local_e8);
        iVar5 = Specification::CoreMLModels::VisionFeaturePrint_Objects::output_size(pVVar8);
        if (iVar5 != 2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,"Two outputs for objects need to be provided",&local_211);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator(&local_211);
          visionFeaturePrint._4_4_ = 1;
          goto LAB_00477184;
        }
        pCVar6 = (CoreML *)Specification::ModelDescription::output(local_20);
        local_26c = kMultiArrayType;
        local_268 = &local_26c;
        local_260 = 1;
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_26d);
        __l._M_len = local_260;
        __l._M_array = local_268;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector(&local_258,__l,&local_26d);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  (&local_240,pCVar6,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x2,
                   (int)&local_258,in_R8);
        Result::operator=((Result *)local_80,&local_240);
        Result::~Result(&local_240);
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~vector(&local_258);
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_26d);
        bVar1 = Result::good((Result *)local_80);
        if (!bVar1) {
          Result::Result(__return_storage_ptr__,(Result *)local_80);
          visionFeaturePrint._4_4_ = 1;
          goto LAB_00477184;
        }
        this = Specification::ModelDescription::output(local_20);
        __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                 begin(this);
        modelOutputFeature._40_8_ =
             google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                       (this);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                       operator!=(&__end2,(iterator *)&modelOutputFeature._cached_size_), bVar1) {
          from = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                           (&__end2);
          Specification::FeatureDescription::FeatureDescription
                    ((FeatureDescription *)&modelOutputFeatureName,from);
          visionFeaturePrintOutputNames =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)Specification::FeatureDescription::name_abi_cxx11_
                            ((FeatureDescription *)&modelOutputFeatureName);
          pVVar8 = Specification::CoreMLModels::VisionFeaturePrint::objects(local_e8);
          local_328 = Specification::CoreMLModels::VisionFeaturePrint_Objects::output_abi_cxx11_
                                (pVVar8);
          local_338.it_ =
               (void **)google::protobuf::
                        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::begin(local_328);
          local_340 = (void **)google::protobuf::
                               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::end(local_328);
          local_330 = std::
                      find<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,std::__cxx11::string>
                                (local_338,
                                 (RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_340,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)visionFeaturePrintOutputNames);
          local_348.it_ =
               (void **)google::protobuf::
                        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::end(local_328);
          bVar1 = google::protobuf::internal::
                  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator==(&local_330,&local_348);
          if (bVar1) {
            std::__cxx11::stringstream::stringstream(local_4d0);
            poVar9 = std::operator<<(local_4c0,"Model description declares an output: ");
            poVar9 = std::operator<<(poVar9,(string *)visionFeaturePrintOutputNames);
            std::operator<<(poVar9," but it is not declared in Vision Feature Print output");
            std::__cxx11::stringstream::str();
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_4f0);
            std::__cxx11::string::~string((string *)&local_4f0);
            visionFeaturePrint._4_4_ = 1;
            std::__cxx11::stringstream::~stringstream(local_4d0);
          }
          else {
            visionFeaturePrint._4_4_ = 0;
          }
          Specification::FeatureDescription::~FeatureDescription
                    ((FeatureDescription *)&modelOutputFeatureName);
          if (visionFeaturePrint._4_4_ != 0) goto LAB_00477184;
          google::protobuf::internal::
          RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2);
        }
      }
      Result::Result(__return_storage_ptr__,(Result *)local_80);
      visionFeaturePrint._4_4_ = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_80);
    visionFeaturePrint._4_4_ = 1;
  }
LAB_00477184:
  Result::~Result((Result *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_visionFeaturePrint>(const Specification::Model &format) {
        const auto &interface = format.description();

        // make sure model is a vision feature print
        if (!format.has_visionfeatureprint()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a vision feature print.");
        }

        Result result;

        // validate the inputs: only one input with image type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kImageType});
        if (!result.good()) {
            return result;
        }

        // other validate logics here
        const auto &visionFeaturePrint = format.visionfeatureprint();
        switch (visionFeaturePrint.VisionFeaturePrintType_case()) {
            case Specification::CoreMLModels::VisionFeaturePrint::kScene:
                if (visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_INVALID) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version for scene is invalid");
                } else if (visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1 || visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_2) {
                    // validate the outputs: only one output with multiarray type is allowed for version 1 and version 2.
                    result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
                    if (!result.good()) {
                        return result;
                    }
                } else {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version: '" + std::to_string(visionFeaturePrint.scene().version()) + "' for scene print is invalid");
                }
                break;
            case Specification::CoreMLModels::VisionFeaturePrint::kObjects:
                if (visionFeaturePrint.objects().version() == Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version for objects is invalid");
                } else if (visionFeaturePrint.objects().version() == Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1) {

                    if (visionFeaturePrint.objects().output_size() != 2) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "Two outputs for objects need to be provided");
                    }

                    // validate the outputs: only two outputs with multiarray type is allowed for version 1.
                    result = validateDescriptionsContainFeatureWithTypes(interface.output(), 2, {Specification::FeatureType::kMultiArrayType});
                    if (!result.good()) {
                        return result;
                    }
                } else {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version: '" + std::to_string(visionFeaturePrint.objects().version()) + "' for object print is invalid");
                }

                for (auto modelOutputFeature : interface.output()) {
                    const std::string &modelOutputFeatureName = modelOutputFeature.name();
                    const auto &visionFeaturePrintOutputNames = visionFeaturePrint.objects().output();
                    if (find(visionFeaturePrintOutputNames.begin(), visionFeaturePrintOutputNames.end(), modelOutputFeatureName) == visionFeaturePrintOutputNames.end()) {
                        std::stringstream ss;
                        ss << "Model description declares an output: " << modelOutputFeatureName << " but it is not declared in Vision Feature Print output";
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
                    }
                }
                break;
            case Specification::CoreMLModels::VisionFeaturePrint::VISIONFEATUREPRINTTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Type for vision feature print not set");
        }

        return result;
    }